

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  undefined8 __stream;
  undefined8 uVar1;
  ostream *local_1e0;
  string local_1d8;
  undefined1 local_1a8 [8];
  stringstream stream;
  FILE *xmlout;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites_local;
  XmlUnitTestResultPrinter *this_local;
  
  stream._384_8_ = OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  local_1e0 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a8) {
    local_1e0 = (ostream *)&stream.field_0x8;
  }
  PrintXmlTestsList(local_1e0,test_suites);
  __stream = stream._384_8_;
  StringStreamToString(&local_1d8,(stringstream *)local_1a8);
  uVar1 = std::__cxx11::string::c_str();
  fprintf((FILE *)__stream,"%s",uVar1);
  std::__cxx11::string::~string((string *)&local_1d8);
  fclose((FILE *)stream._384_8_);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestSuite*>& test_suites) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_suites);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}